

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O3

int do_decompress(Dwarf_Debug dbg,Dwarf_Section_s *section,Dwarf_Error *error)

{
  Dwarf_Unsigned DVar1;
  Dwarf_Unsigned DVar2;
  bool bVar3;
  dwarfstring_u v;
  int iVar4;
  long lVar5;
  Dwarf_Small *pDVar6;
  size_t sVar7;
  char *pcVar8;
  Dwarf_Signed DVar9;
  Dwarf_Small *pDVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Dwarf_Unsigned _ltmp;
  dwarfstring m;
  dwarfstring_u local_b8 [13];
  dwarfstring_s local_50;
  
  DVar1 = section->dss_size;
  if ((long)DVar1 < 0xc) {
    pcVar8 = "DW_DLE_ZLIB_SECTION_SHORTSection too short to be either zlib or zstd related";
    DVar9 = 0x152;
    goto LAB_00167e67;
  }
  pDVar6 = section->dss_data;
  DVar2 = section->dss_flags;
  section->dss_compressed_length = DVar1;
  iVar4 = strncmp("ZLIB",(char *)pDVar6,4);
  if (iVar4 == 0) {
    pDVar10 = pDVar6 + 0xc;
    lVar5 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)pDVar6[lVar5 + 4] | uVar12 << 8;
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != 8);
    uVar11 = DVar1 - 0xc;
    section->dss_uncompressed_length = uVar12;
    section->dss_ZLIB_compressed = '\x01';
LAB_00167cc1:
    if ((uVar11 < 0x33) || (uVar11 >> 1 <= uVar12)) {
      if (uVar11 << 4 < uVar11) {
        pcVar8 = 
        "DW_DLE_ZLIB_UNCOMPRESS_ERROR: The zlib compressed section  is absurdly large so arithmentic overflow. So corrupt dwarf"
        ;
      }
      else {
        bVar3 = true;
        if (uVar12 <= uVar11 << 4) {
LAB_00167e8b:
          if (pDVar6 + DVar1 < pDVar10 + uVar11) {
            pcVar8 = 
            "DW_DLE_ZDEBUG_ZLIB_SECTION_SHORT The zstd or zlib compressed section  is longer than the section length. So corrupt dwarf"
            ;
            DVar9 = 0x152;
          }
          else {
            pDVar6 = (Dwarf_Small *)malloc(uVar12);
            if (pDVar6 == (Dwarf_Small *)0x0) {
              pcVar8 = 
              "DW_DLE_ALLOC_FAIL The zstd or zlib uncompressed space malloc failed: out of memory";
              DVar9 = 0x3e;
            }
            else {
              if (bVar3) {
                local_b8[0] = uVar12;
                iVar4 = uncompress(pDVar6,local_b8,pDVar10,uVar11);
                if (iVar4 == -5) {
                  DVar9 = 0x13c;
                }
                else {
                  if (iVar4 == 0) goto LAB_00167f19;
                  if (iVar4 == -4) {
                    DVar9 = 0x3e;
                  }
                  else {
                    DVar9 = 0x13d;
                  }
                }
                free(pDVar6);
                _dwarf_error(dbg,error,DVar9);
                return 1;
              }
              sVar7 = ZSTD_decompress(pDVar6,uVar12,pDVar10,uVar11);
              if (sVar7 == uVar12) {
LAB_00167f19:
                section->dss_data = pDVar6;
                section->dss_size = uVar12;
                section->dss_data_was_malloc = '\x01';
                section->dss_did_decompress = '\x01';
                return 0;
              }
              free(pDVar6);
              pcVar8 = "DW_DLE_ZLIB_DATA_ERROR The zstd ZSTD_decompress() failed.";
              DVar9 = 0x13d;
            }
          }
          goto LAB_00167e67;
        }
        pcVar8 = 
        "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zlib compressed section  is absurdly large given the input section length. So corrupt dwarf"
        ;
      }
    }
    else {
      pcVar8 = 
      "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zlib compressed section  isabsurdly small. Corrupt dwarf";
    }
  }
  else {
    if (((uint)DVar2 >> 0xb & 1) == 0) {
      pcVar8 = "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD The compressed section is not properly formatted";
      DVar9 = 0x13b;
      goto LAB_00167e67;
    }
    uVar13 = (ulong)dbg->de_pointer_size;
    local_b8[0] = 0;
    (*dbg->de_copy_word)(local_b8,pDVar6,4);
    v = local_b8[0];
    local_b8[0] = 0;
    if (pDVar6 + DVar1 < pDVar6 + uVar13 + uVar13) {
      pcVar8 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
      DVar9 = 0x14b;
      goto LAB_00167e67;
    }
    (*dbg->de_copy_word)(local_b8,pDVar6 + uVar13,uVar13);
    uVar12 = local_b8[0];
    if (v != 2) {
      if (v != 1) {
        dwarfstring_constructor_static(&local_50,(char *)local_b8,100);
        dwarfstring_append_printf_u
                  (&local_50,
                   "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD The SHF_COMPRESSED type field is 0x%x, neither zlib (1) or zstd(2). Corrupt dwarf."
                   ,v);
        pcVar8 = dwarfstring_string(&local_50);
        _dwarf_error_string(dbg,error,0x13b,pcVar8);
        dwarfstring_destructor(&local_50);
        return 1;
      }
      section->dss_uncompressed_length = local_b8[0];
      pDVar10 = pDVar6 + uVar13 * 3;
      uVar11 = DVar1 + uVar13 * -3;
      section->dss_shf_compressed = '\x01';
      goto LAB_00167cc1;
    }
    section->dss_uncompressed_length = local_b8[0];
    uVar11 = DVar1 + uVar13 * -3;
    section->dss_shf_compressed = '\x01';
    if (local_b8[0] < uVar11 >> 1 && 0x32 < uVar11) {
      pcVar8 = 
      "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  isabsurdly small. Corrupt dwarf";
    }
    else if (uVar11 * 0x10 < uVar11) {
      pcVar8 = 
      "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  is absurdly large so arithmentic overflow. So corrupt dwarf"
      ;
    }
    else {
      if (local_b8[0] <= uVar11 * 0x10) {
        pDVar10 = pDVar6 + uVar13 * 3;
        bVar3 = false;
        goto LAB_00167e8b;
      }
      pcVar8 = 
      "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  is absurdly large given the input section length. So corrupt dwarf"
      ;
    }
  }
  DVar9 = 0x170;
LAB_00167e67:
  _dwarf_error_string(dbg,error,DVar9,pcVar8);
  return 1;
}

Assistant:

static int
do_decompress(Dwarf_Debug dbg,
    struct Dwarf_Section_s *section,
    Dwarf_Error * error)
{
    Dwarf_Small *basesrc = section->dss_data;
    Dwarf_Small *src = basesrc;
    Dwarf_Small *dest = 0;
    Dwarf_Unsigned destlen = 0;
    Dwarf_Unsigned srclen = section->dss_size;
    Dwarf_Unsigned flags = section->dss_flags;
    Dwarf_Small *endsection = 0;
    int zstdcompress = FALSE;
    Dwarf_Unsigned uncompressed_len = 0;

    endsection = basesrc + section->dss_size;
    if ((basesrc + 12) > endsection) {
        _dwarf_error_string(dbg, error,DW_DLE_ZLIB_SECTION_SHORT,
            "DW_DLE_ZLIB_SECTION_SHORT"
            "Section too short to be either zlib or zstd related");
        return DW_DLV_ERROR;
    }
    section->dss_compressed_length = srclen;
    if (!strncmp("ZLIB",(const char *)src,4)) {
        unsigned i = 0;
        unsigned l = 8;
        unsigned char *c = src+4;
        for ( ; i < l; ++i,c++) {
            uncompressed_len <<= 8;
            uncompressed_len += *c;
        }
        src = src + 12;
        srclen -= 12;
        section->dss_uncompressed_length = uncompressed_len;
        section->dss_ZLIB_compressed = TRUE;
    } else  if (flags & SHF_COMPRESSED) {
        /*  The prefix is a struct:
            unsigned int type; followed by pad if following are 64bit!
            size-of-target-address size
            size-of-target-address
        */
        Dwarf_Small *ptr    = (Dwarf_Small *)src;
        Dwarf_Unsigned type = 0;
        Dwarf_Unsigned size = 0;
        /* Dwarf_Unsigned addralign = 0; */
        unsigned fldsize    = dbg->de_pointer_size;
        unsigned structsize = 3* fldsize;
        READ_UNALIGNED_CK(dbg,type,Dwarf_Unsigned,ptr,
            DWARF_32BIT_SIZE,
            error,endsection);
        ptr += fldsize;
        READ_UNALIGNED_CK(dbg,size,Dwarf_Unsigned,ptr,fldsize,
            error,endsection);
        switch(type) {
        case ELFCOMPRESS_ZLIB:
            break;
        case ELFCOMPRESS_ZSTD:
            zstdcompress = TRUE;
            break;
        default: {
            char buf[100];
            dwarfstring m;

            dwarfstring_constructor_static(&m,buf,sizeof(buf));
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD"
                " The SHF_COMPRESSED type field is 0x%x, neither"
                " zlib (1) or zstd(2). Corrupt dwarf.", type);
            _dwarf_error_string(dbg, error,
                DW_DLE_ZDEBUG_INPUT_FORMAT_ODD,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        }
        uncompressed_len = size;
        section->dss_uncompressed_length = uncompressed_len;
        src    += structsize;
        srclen -= structsize;
        section->dss_shf_compressed = TRUE;
    } else {
        _dwarf_error_string(dbg, error,
            DW_DLE_ZDEBUG_INPUT_FORMAT_ODD,
            "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD"
            " The compressed section is not properly formatted");
        return DW_DLV_ERROR;
    }
    if (!zstdcompress) {
        /*  According to zlib.net zlib essentially never expands
            the data when compressing.  There is no statement
            about  any effective limit in the compression factor
            though we, here, assume  such a limit to check
            for sanity in the object file.
            These tests are heuristics.  */
        Dwarf_Unsigned max_inflated_len =
            srclen*ALLOWED_ZLIB_INFLATION;

        if (srclen > 50)  {
            /*  If srclen not super tiny lets check the following. */
            if (uncompressed_len < (srclen/2)) {
                /*  Violates the approximate invariant about
                    compression not actually inflating. */
                _dwarf_error_string(dbg, error,
                    DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                    "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                    " The zlib compressed section  is"
                    "absurdly small. Corrupt dwarf");
                return DW_DLV_ERROR;
            }
        }
        if (max_inflated_len < srclen) {
            /* The calculation overflowed. */
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR:"
                " The zlib compressed section  is"
                " absurdly large so arithmentic overflow."
                " So corrupt dwarf");
            return DW_DLV_ERROR;
        }
        if (uncompressed_len > max_inflated_len) {
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zlib compressed section  is"
                " absurdly large given the input section"
                " length. So corrupt dwarf");
            return DW_DLV_ERROR;
        }
    }
    if (zstdcompress) {
        /*  According to zlib.net zlib essentially never expands
            the data when compressing.  There is no statement
            about  any effective limit in the compression factor
            though we, here, assume  such a limit to check
            for sanity in the object file.
            These tests are heuristics.  */
        Dwarf_Unsigned max_inflated_len =
            srclen*ALLOWED_ZSTD_INFLATION;

        if (srclen > 50)  {
            /*  If srclen not super tiny lets check the following. */
            if (uncompressed_len < (srclen/2)) {
                /*  Violates the approximate invariant about
                    compression not actually inflating. */
                _dwarf_error_string(dbg, error,
                    DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                    "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                    " The zstd compressed section  is"
                    "absurdly small. Corrupt dwarf");
                return DW_DLV_ERROR;
            }
        }
        if (max_inflated_len < srclen) {
            /* The calculation overflowed. */
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zstd compressed section  is"
                " absurdly large so arithmentic overflow."
                " So corrupt dwarf");
            return DW_DLV_ERROR;
        }
        if (uncompressed_len > max_inflated_len) {
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zstd compressed section  is"
                " absurdly large given the input section"
                " length. So corrupt dwarf");
            return DW_DLV_ERROR;
        }
    }
    if ((src +srclen) > endsection) {
        _dwarf_error_string(dbg, error,
            DW_DLE_ZLIB_SECTION_SHORT,
            "DW_DLE_ZDEBUG_ZLIB_SECTION_SHORT"
            " The zstd or zlib compressed section  is"
            " longer than the section"
            " length. So corrupt dwarf");
        return DW_DLV_ERROR;
    }
    destlen = uncompressed_len;
    dest = malloc(destlen);
    if (!dest) {
        _dwarf_error_string(dbg, error,
            DW_DLE_ALLOC_FAIL,
            "DW_DLE_ALLOC_FAIL"
            " The zstd or zlib uncompressed space"
            " malloc failed: out of memory");
        return DW_DLV_ERROR;
    }
    /*  uncompress is a zlib function. */
    if (!zstdcompress) {
        int res = 0;
        uLongf dlen = destlen;

        res = uncompress(dest,&dlen,src,srclen);
        if (res == Z_BUF_ERROR) {
            free(dest);
            DWARF_DBG_ERROR(dbg, DW_DLE_ZLIB_BUF_ERROR, DW_DLV_ERROR);
        } else if (res == Z_MEM_ERROR) {
            free(dest);
            DWARF_DBG_ERROR(dbg, DW_DLE_ALLOC_FAIL, DW_DLV_ERROR);
        } else if (res != Z_OK) {
            free(dest);
            /* Probably Z_DATA_ERROR. */
            DWARF_DBG_ERROR(dbg, DW_DLE_ZLIB_DATA_ERROR,
                DW_DLV_ERROR);
        }
    }
    if (zstdcompress) {
        size_t zsize =
            ZSTD_decompress(dest,destlen,src,srclen);
        if (zsize != destlen) {
            free(dest);
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_DATA_ERROR,
                "DW_DLE_ZLIB_DATA_ERROR"
                " The zstd ZSTD_decompress() failed.");
            return DW_DLV_ERROR;
        }
    }
    /* Z_OK */
    section->dss_data = dest;
    section->dss_size = destlen;
    section->dss_data_was_malloc = TRUE;
    section->dss_did_decompress = TRUE;
    return DW_DLV_OK;
}